

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry.cpp
# Opt level: O0

float __thiscall indk::Neuron::Entry::getIn(Entry *this)

{
  long lVar1;
  int64_t d;
  Entry *this_local;
  
  lVar1 = (this->tm - this->t) + 1;
  if ((lVar1 < 1) || (this->SignalPointer - lVar1 < 0)) {
    this_local._4_4_ = 0.0;
  }
  else {
    this->t = this->t + 1;
    this_local._4_4_ = this->Signal[this->SignalPointer - lVar1];
  }
  return this_local._4_4_;
}

Assistant:

float indk::Neuron::Entry::getIn() {
    auto d = tm - t + 1;
    if (d > 0 && SignalPointer-d >= 0) {
        t++;
        return Signal[SignalPointer-d];
    }
    return 0;
}